

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O0

ostream * eglu::operator<<(ostream *str,ConfigAttribValueFmt *attribFmt)

{
  Bitfield<16UL> decoder;
  Bitfield<16UL> decoder_00;
  Hex<8UL> hex;
  Enum<int,_2UL> EVar1;
  Enum<int,_2UL> local_c8;
  GetNameFunc local_b8;
  int local_b0;
  Enum<int,_2UL> local_a8;
  deUint64 local_98;
  Bitfield<16UL> local_90;
  Bitfield<16UL> local_78;
  GetNameFunc local_60;
  int local_58;
  Enum<int,_2UL> local_50;
  GetNameFunc local_40;
  int local_38;
  Enum<int,_2UL> local_30;
  ConfigAttribValueFmt *local_20;
  ConfigAttribValueFmt *attribFmt_local;
  ostream *str_local;
  
  local_20 = attribFmt;
  attribFmt_local = (ConfigAttribValueFmt *)str;
  switch(attribFmt->attribute) {
  case 0x3020:
  case 0x3021:
  case 0x3022:
  case 0x3023:
  case 0x3024:
  case 0x3025:
  case 0x3026:
  case 0x3028:
  case 0x3029:
  case 0x3031:
  case 0x3032:
  case 0x3035:
  case 0x3036:
  case 0x3037:
  case 0x303b:
  case 0x303c:
  case 0x303d:
  case 0x303e:
    str_local = (ostream *)std::ostream::operator<<(str,attribFmt->value);
    break;
  case 0x3027:
    EVar1 = getConfigCaveatStr(attribFmt->value);
    local_60 = EVar1.m_getName;
    local_58 = EVar1.m_value;
    local_50.m_getName = local_60;
    local_50.m_value = local_58;
    str_local = tcu::Format::operator<<(str,&local_50);
    break;
  default:
    hex = tcu::toHex<int>(attribFmt->value);
    str_local = tcu::Format::operator<<(str,hex);
    break;
  case 0x302d:
  case 0x3039:
  case 0x303a:
    EVar1 = getBoolDontCareStr(attribFmt->value);
    local_c8.m_getName = EVar1.m_getName;
    local_c8.m_value = EVar1.m_value;
    str_local = tcu::Format::operator<<(str,&local_c8);
    break;
  case 0x3033:
    getSurfaceBitsStr(&local_90,attribFmt->value);
    decoder_00.m_begin = local_90.m_begin;
    decoder_00.m_value = local_90.m_value;
    decoder_00.m_end = local_90.m_end;
    str_local = tcu::Format::operator<<(str,decoder_00);
    break;
  case 0x3034:
    EVar1 = getTransparentTypeStr(attribFmt->value);
    local_b8 = EVar1.m_getName;
    local_b0 = EVar1.m_value;
    local_a8.m_getName = local_b8;
    local_a8.m_value = local_b0;
    str_local = tcu::Format::operator<<(str,&local_a8);
    break;
  case 0x303f:
    EVar1 = getColorBufferTypeStr(attribFmt->value);
    local_40 = EVar1.m_getName;
    local_38 = EVar1.m_value;
    local_30.m_getName = local_40;
    local_30.m_value = local_38;
    str_local = tcu::Format::operator<<(str,&local_30);
    break;
  case 0x3040:
  case 0x3042:
    getAPIBitsStr(&local_78,attribFmt->value);
    decoder.m_begin = local_78.m_begin;
    decoder.m_value = local_78.m_value;
    decoder.m_end = local_78.m_end;
    str_local = tcu::Format::operator<<(str,decoder);
    break;
  case 0x3041:
    if (attribFmt->value == 0x3038) {
      str_local = std::operator<<(str,"EGL_NONE");
    }
    else {
      local_98 = (deUint64)tcu::toHex<int>(attribFmt->value);
      str_local = tcu::Format::operator<<(str,(Hex<8UL>)local_98);
    }
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConfigAttribValueFmt& attribFmt)
{
	switch (attribFmt.attribute)
	{
		case EGL_COLOR_BUFFER_TYPE:
			return str << getColorBufferTypeStr(attribFmt.value);

		case EGL_CONFIG_CAVEAT:
			return str << getConfigCaveatStr(attribFmt.value);

		case EGL_CONFORMANT:
		case EGL_RENDERABLE_TYPE:
			return str << getAPIBitsStr(attribFmt.value);

		case EGL_SURFACE_TYPE:
			return str << getSurfaceBitsStr(attribFmt.value);

		case EGL_MATCH_NATIVE_PIXMAP:
			if (attribFmt.value == EGL_NONE)
				return str << "EGL_NONE";
			else
				return str << tcu::toHex(attribFmt.value);

		case EGL_TRANSPARENT_TYPE:
			return str << getTransparentTypeStr(attribFmt.value);

		case EGL_BIND_TO_TEXTURE_RGB:
		case EGL_BIND_TO_TEXTURE_RGBA:
		case EGL_NATIVE_RENDERABLE:
			return str << getBoolDontCareStr(attribFmt.value);

		case EGL_ALPHA_MASK_SIZE:
		case EGL_ALPHA_SIZE:
		case EGL_BLUE_SIZE:
		case EGL_BUFFER_SIZE:
		case EGL_CONFIG_ID:
		case EGL_DEPTH_SIZE:
		case EGL_GREEN_SIZE:
		case EGL_LEVEL:
		case EGL_LUMINANCE_SIZE:
		case EGL_MAX_SWAP_INTERVAL:
		case EGL_MIN_SWAP_INTERVAL:
		case EGL_RED_SIZE:
		case EGL_SAMPLE_BUFFERS:
		case EGL_SAMPLES:
		case EGL_STENCIL_SIZE:
		case EGL_TRANSPARENT_RED_VALUE:
		case EGL_TRANSPARENT_GREEN_VALUE:
		case EGL_TRANSPARENT_BLUE_VALUE:
			return str << (int)attribFmt.value;

		default:
			return str << tcu::toHex(attribFmt.value);
	}
}